

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O3

_Bool ppc_cpu_exec_interrupt_ppc64(CPUState *cs,int interrupt_request)

{
  byte *pbVar1;
  uint uVar2;
  TranslationBlock *pTVar3;
  _Bool _Var4;
  uint uVar5;
  int excp;
  TranslationBlock *pTVar6;
  char cVar7;
  int excp_model;
  bool bVar8;
  
  if ((interrupt_request & 2U) == 0) goto LAB_00b51883;
  uVar2 = *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec);
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 4) != 0) {
      *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffffffa;
      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
      excp = 1;
      goto LAB_00b5186f;
    }
    pTVar3 = cs[1].tb_jmp_cache[0x3a9];
    uVar5 = (uint)pTVar3;
    if ((short)pTVar3 < 0) {
      cVar7 = '\x01';
      if (((uVar2 >> 9 & 1) != 0) && (((ulong)cs[1].tb_jmp_cache[0x5fa] & 1) != 0))
      goto LAB_00b5197e;
LAB_00b518a9:
      if ((uVar2 >> 0x12 & 1) == 0) {
        if ((uVar2 & 8) != 0) {
          pTVar6 = cs[1].tb_jmp_cache[0x5fa];
          bVar8 = ((ulong)pTVar6 & 8) == 0;
          if (cVar7 == '\0') goto LAB_00b519a5;
LAB_00b519b0:
          cVar7 = '\x01';
          if (((ulong)pTVar3 & 0x1000000000004000) == 0x1000000000000000 &&
              ((ulong)pTVar6 & 0x10) != 0) goto LAB_00b519d9;
          goto LAB_00b519f3;
        }
LAB_00b51a07:
        if ((uVar2 & 0x20) != 0 && (uVar5 >> 0x11 & 1) != 0) goto LAB_00b51a8e;
        if (cVar7 == '\0') goto LAB_00b51a6f;
LAB_00b51a1c:
        if ((uVar2 >> 0xc & 1) == 0) {
          if ((uVar2 >> 0xd & 1) == 0) {
            if ((uVar2 >> 0xb & 1) == 0) {
              if ((uVar2 >> 10 & 1) == 0) {
                if ((uVar2 >> 8 & 1) == 0) {
                  if ((uVar2 >> 0xe & 1) == 0) {
                    if ((uVar2 >> 0x11 & 1) == 0) {
                      if ((short)uVar2 < 0) {
                        *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffd02fa;
                        excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                        excp = 0x55;
                      }
                      else {
                        if (-1 < (char)uVar2) goto LAB_00b51a6f;
                        *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffd027a;
                        excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                        excp = 0x56;
                      }
                    }
                    else {
                      *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffd82fa;
                      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                      excp = 100;
                    }
                  }
                  else {
                    *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffff82fa;
                    excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                    if ((*(byte *)((long)cs[3].tb_jmp_cache + 0x46dd) & 0x20) == 0) {
                      excp = 0x24;
                    }
                    else {
                      excp = 99;
                    }
                  }
                }
                else {
                  _Var4 = ppc_decr_clear_on_delivery_ppc64
                                    ((CPUPPCState_conflict2 *)(cs[1].tb_jmp_cache + 0x359));
                  if (_Var4) {
                    pbVar1 = (byte *)((long)cs[3].tb_jmp_cache + 0x46ed);
                    *pbVar1 = *pbVar1 & 0xfe;
                  }
                  excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                  excp = 10;
                }
              }
              else {
                *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffc3fa;
                excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                excp = 0x4a;
              }
            }
            else {
              *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffc7fa;
              excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
              excp = 0xb;
            }
          }
          else {
            *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffcffa;
            excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
            excp = 0x25;
          }
        }
        else {
          *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffeffa;
          excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
          excp = 0xc;
        }
      }
      else {
        pTVar6 = cs[1].tb_jmp_cache[0x5fa];
        if (cVar7 == '\0') {
LAB_00b51919:
          if ((((ulong)pTVar3 & 0x1000000000000000) != 0) || (((ulong)pTVar6 & 2) == 0))
          goto LAB_00b51961;
        }
        else if (((ulong)pTVar6 & 2) == 0) {
          if ((uVar2 & 8) != 0) {
            bVar8 = ((ulong)pTVar6 & 8) == 0;
            goto LAB_00b519b0;
          }
          if ((uVar2 & 0x20) != 0 && (uVar5 >> 0x11 & 1) != 0) goto LAB_00b51a8e;
          goto LAB_00b51a1c;
        }
        excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
        excp = 0x65;
      }
      goto LAB_00b5186f;
    }
    cVar7 = *(char *)((long)cs[3].tb_jmp_cache + 0x4a5a);
    if ((uVar2 >> 9 & 1) == 0) goto LAB_00b518a9;
    pTVar6 = cs[1].tb_jmp_cache[0x5fa];
    if (cVar7 != '\0') {
      cVar7 = '\x01';
      if (((ulong)pTVar6 & 1) == 0) goto LAB_00b518a9;
LAB_00b5197e:
      *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffffdfa;
      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
      excp = 0x43;
      goto LAB_00b5186f;
    }
    if (((ulong)pTVar3 & 0x1000000000000000) == 0 && ((ulong)pTVar6 & 1) != 0) goto LAB_00b5197e;
    if ((uVar2 >> 0x12 & 1) != 0) goto LAB_00b51919;
LAB_00b51961:
    if ((uVar2 & 8) != 0) {
      bVar8 = ((ulong)pTVar6 & 8) == 0;
LAB_00b519a5:
      cVar7 = '\0';
LAB_00b519d9:
      if ((*(char *)((long)cs[3].tb_jmp_cache + 0x4a59) != '\x01') ||
         (!(bool)(((ulong)pTVar3 >> 0x3c & 1) == 0 & bVar8))) goto LAB_00b51a07;
LAB_00b519f3:
      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
      excp = 4;
      goto LAB_00b5186f;
    }
    if ((uVar2 & 0x20) != 0 && (uVar5 >> 0x11 & 1) != 0) {
LAB_00b51a8e:
      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
      excp = 0;
      goto LAB_00b5186f;
    }
LAB_00b51a6f:
    if (*(char *)((long)cs[3].tb_jmp_cache + 0x4a5a) == '\x01') {
      cpu_abort_ppc64(cs,"Wakeup from PM state but interrupt Undelivered");
    }
  }
  else {
    *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffffffe;
    excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
    excp = 0x40;
LAB_00b5186f:
    powerpc_excp((PowerPCCPU_conflict3 *)cs,excp_model,excp);
  }
  if (*(int *)((long)cs[3].tb_jmp_cache + 0x46ec) == 0) {
    *(byte *)&cs->interrupt_request = (byte)cs->interrupt_request & 0xfd;
  }
LAB_00b51883:
  return SUB41((interrupt_request & 2U) >> 1,0);
}

Assistant:

bool ppc_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    CPUPPCState *env = &cpu->env;

    if (interrupt_request & CPU_INTERRUPT_HARD) {
        ppc_hw_interrupt(env);
        if (env->pending_interrupts == 0) {
            cs->interrupt_request &= ~CPU_INTERRUPT_HARD;
        }
        return true;
    }
    return false;
}